

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraphBuilder.h
# Opt level: O2

void __thiscall
dg::llvmdg::LLVMDependenceGraphBuilder::_runControlDependenceAnalysis
          (LLVMDependenceGraphBuilder *this)

{
  clock_t cVar1;
  uint64_t uVar2;
  
  cVar1 = clock();
  this->_time_start = cVar1;
  dg::LLVMDependenceGraph::computeControlDependencies
            ((LLVMControlDependenceAnalysisOptions *)
             (this->_dg)._M_t.
             super___uniq_ptr_impl<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
             ._M_t.
             super__Tuple_impl<0UL,_dg::LLVMDependenceGraph_*,_std::default_delete<dg::LLVMDependenceGraph>_>
             .super__Head_base<0UL,_dg::LLVMDependenceGraph_*,_false>._M_head_impl);
  uVar2 = _timerEnd(this);
  (this->_statistics).cdaTime = uVar2;
  return;
}

Assistant:

void _runControlDependenceAnalysis() {
        _timerStart();
        //_CDA->run();
        // FIXME: until we get rid of the legacy code,
        // use the old way of inserting CD edges directly
        // into the dg
        _dg->computeControlDependencies(_options.CDAOptions);
        _statistics.cdaTime = _timerEnd();
    }